

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall fmt::v7::detail::fp::assign_with_boundaries<double>(fp *this,double d)

{
  boundaries bVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  fp fVar3;
  fp local_60;
  fp upper;
  fp lower;
  bool is_lower_closer;
  double d_local;
  fp *this_local;
  
  bVar2 = assign<double,_0>(this,d);
  if (bVar2) {
    fp((fp *)&upper.e,this->f * 4 - 1,this->e + -2);
  }
  else {
    fp((fp *)&upper.e,this->f * 2 - 1,this->e + -1);
  }
  fp(&local_60,this->f * 2 + 1,this->e + -1);
  fVar3.f = (ulong)(uint)local_60.e;
  fVar3._8_8_ = extraout_RDX;
  fVar3 = normalize<1>((detail *)local_60.f,fVar3);
  bVar1.upper = fVar3.f;
  bVar1.lower = upper._8_8_ << ((char)lower.f - (char)fVar3.e & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }